

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseElseIfStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> false_branch;
  int block_end_line;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> true_branch;
  int in_stack_000000dc;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_000000e0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  int line;
  undefined1 in_stack_00000100 [32];
  ParserImpl *in_stack_ffffffffffffff00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff18;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *true_branch_00;
  ParserImpl *in_stack_ffffffffffffff28;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp_00;
  ElseIfStatement *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  SyntaxTree in_stack_ffffffffffffff78;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_stack_ffffffffffffff80;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_78 [2];
  int local_64;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_48;
  ParserImpl *pPStack_40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_30;
  undefined4 local_14;
  
  NextToken(in_stack_ffffffffffffff00);
  if (*(int *)(in_RSI + 0x20) != 0x104) {
    __assert_fail("current_.token_ == Token_Elseif",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x166,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseElseIfStatement()"
                 );
  }
  local_14 = *(undefined4 *)(in_RSI + 0x18);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff00);
  luna::TokenDetail::TokenDetail((TokenDetail *)&local_48);
  ParseExp((ParserImpl *)
           exp._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
           _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,in_stack_000000e0,
           (TokenDetail)in_stack_00000100,in_stack_000000dc);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  pTVar1 = NextToken(pPStack_40);
  if (pTVar1->token_ != 0x111) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)in_stack_ffffffffffffff80._M_head_impl,
               (char *)in_stack_ffffffffffffff78._vptr_SyntaxTree,
               (TokenDetail *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  ParseBlock((ParserImpl *)in_stack_ffffffffffffff78._vptr_SyntaxTree);
  pTVar1 = LookAhead(pPStack_40);
  local_64 = pTVar1->line_;
  ParseFalseBranchStatement(in_stack_ffffffffffffff28);
  operator_new(0x28);
  true_branch_00 = local_78;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  exp_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
           &stack0xffffffffffffff80;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  this_00 = (ElseIfStatement *)&stack0xffffffffffffff78;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48.str_);
  luna::ElseIfStatement::ElseIfStatement
            (this_00,exp_00,true_branch_00,in_stack_ffffffffffffff18,
             (int)((ulong)puStack_30 >> 0x20),(int)puStack_30);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_40,
             (pointer)local_48.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_30)
  ;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseElseIfStatement()
        {
            NextToken();                // skip 'elseif'
            assert(current_.token_ == Token_Elseif);
            int line = current_.line_;

            std::unique_ptr<SyntaxTree> exp = ParseExp();

            if (NextToken().token_ != Token_Then)
                throw ParseException("expect 'then' for elseif", current_);

            std::unique_ptr<SyntaxTree> true_branch = ParseBlock();
            int block_end_line = LookAhead().line_;
            std::unique_ptr<SyntaxTree> false_branch = ParseFalseBranchStatement();

            return std::unique_ptr<SyntaxTree>(new ElseIfStatement(std::move(exp),
                                                                   std::move(true_branch),
                                                                   std::move(false_branch),
                                                                   line, block_end_line));
        }